

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthread.cpp
# Opt level: O3

void QThread::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  Priority priority;
  long in_FS_OFFSET;
  undefined1 local_19;
  void *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == started && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_00340322_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00340322_default;
  switch(_id) {
  case 0:
    iVar3 = 0;
    goto LAB_00340421;
  case 1:
    iVar3 = 1;
LAB_00340421:
    local_10 = &local_19;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
switchD_00340322_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 2:
    priority = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
LAB_003403d7:
      start((QThread *)_o,priority);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      priority = InheritPriority;
      goto LAB_003403d7;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      terminate((QThread *)_o);
      return;
    }
    break;
  case 5:
    iVar3 = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
LAB_00340451:
      exit((QThread *)_o,iVar3);
      return;
    }
    break;
  case 6:
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar3 = 0;
      goto LAB_00340451;
    }
    break;
  default:
    goto switchD_00340322_default;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThread *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished(QPrivateSignal()); break;
        case 2: _t->start((*reinterpret_cast< std::add_pointer_t<Priority>>(_a[1]))); break;
        case 3: _t->start(); break;
        case 4: _t->terminate(); break;
        case 5: _t->exit((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->exit(); break;
        case 7: _t->quit(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::finished, 1))
            return;
    }
}